

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

SVInt slang::SVInt::fromDecimalDigits
                (bitwidth_t bits,bool isSigned,
                span<const_slang::logic_t,_18446744073709551615UL> digits)

{
  ulong *puVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ulong *__s;
  invalid_argument *piVar11;
  ulong uVar12;
  ulong extraout_RDX;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  undefined7 in_register_00000031;
  ulong uVar16;
  undefined4 in_register_0000003c;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar17;
  ulong uVar18;
  ulong in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  ulong uVar19;
  __extent_storage<18446744073709551615UL> _Var20;
  __extent_storage<18446744073709551615UL> _Var21;
  bool bVar22;
  bool bVar23;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  SVInt SVar24;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string sStack_88;
  undefined4 local_64;
  undefined8 local_60;
  uint local_58 [4];
  undefined4 local_48;
  
  aVar17.val._4_4_ = in_register_0000003c;
  aVar17.val._0_4_ = bits;
  local_60 = CONCAT71(in_register_00000031,isSigned);
  _Var21 = digits._M_extent._M_extent_value;
  local_64 = digits._M_ptr._0_4_;
  uVar19 = (ulong)((int)local_60 + 0x3fU >> 3 & 0xfffffff8);
  __s = (ulong *)operator_new__(uVar19);
  uVar15 = 0;
  memset(__s,0,uVar19);
  *(ulong **)aVar17 = __s;
  *(int *)(aVar17.val + 8) = (int)local_60;
  *(char *)(aVar17.val + 0xc) = (char)local_64;
  *(undefined1 *)(aVar17.val + 0xd) = 0;
  uVar16 = 0x12;
  uVar19 = extraout_RDX;
  if (0x12 < in_R8) {
    uVar15 = 0;
    _Var20._M_extent_value = _Var21._M_extent_value;
    do {
      bVar3 = *(byte *)_Var20._M_extent_value;
      if (9 < bVar3) {
        piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
        local_48 = 10;
        fmt_01.size_ = 0x12;
        fmt_01.data_ = (char *)0x1f;
        args_01.field_1.values_ = in_R9.values_;
        args_01.desc_ = (unsigned_long_long)local_58;
        local_58[0] = (uint)bVar3;
        ::fmt::v11::vformat_abi_cxx11_
                  (&sStack_88,(v11 *)"Digit {} too large for radix {}",fmt_01,args_01);
        std::invalid_argument::invalid_argument(piVar11,(string *)&sStack_88);
        __cxa_throw(piVar11,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      uVar18 = (ulong)bVar3;
      _Var21._M_extent_value = _Var20._M_extent_value + 0x12;
      lVar13 = 1;
      do {
        bVar3 = *(byte *)(_Var20._M_extent_value + lVar13);
        if (9 < bVar3) {
          piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
          local_48 = 10;
          fmt.size_ = 0x12;
          fmt.data_ = (char *)0x1f;
          args.field_1.values_ = in_R9.values_;
          args.desc_ = (unsigned_long_long)local_58;
          local_58[0] = (uint)bVar3;
          ::fmt::v11::vformat_abi_cxx11_
                    (&sStack_88,(v11 *)"Digit {} too large for radix {}",fmt,args);
          std::invalid_argument::invalid_argument(piVar11,(string *)&sStack_88);
          __cxa_throw(piVar11,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        uVar18 = (ulong)bVar3 + uVar18 * 10;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x12);
      if (uVar15 == 0) {
        uVar19 = 0x12;
        if (uVar18 != 0) {
          *__s = uVar18;
          uVar15 = 1;
        }
      }
      else {
        uVar12 = (ulong)uVar15;
        uVar19 = 0;
        in_R9.values_ = (value<fmt::v11::context> *)0x0;
        do {
          auVar9._8_8_ = 0;
          auVar9._0_8_ = in_R9;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = __s[uVar19];
          auVar9 = ZEXT816(1000000000000000000) * auVar7 + auVar9;
          in_R9 = auVar9._8_8_;
          __s[uVar19] = auVar9._0_8_;
          uVar19 = uVar19 + 1;
        } while (uVar12 != uVar19);
        bVar22 = false;
        uVar14 = 0;
        do {
          puVar1 = __s + uVar14;
          uVar4 = (ulong)bVar22;
          uVar2 = *puVar1;
          uVar5 = *puVar1 + uVar18;
          bVar22 = CARRY8(uVar2,uVar18) || CARRY8(uVar5,uVar4);
          *puVar1 = uVar5 + uVar4;
          uVar19 = uVar14;
          if (!CARRY8(uVar2,uVar18) && !CARRY8(uVar5,uVar4)) break;
          uVar19 = uVar14 + 1;
          uVar18 = 0;
          bVar23 = uVar12 - 1 != uVar14;
          uVar14 = uVar19;
        } while (bVar23);
        uVar18 = (long)&(in_R9.values_)->field_0 + (ulong)bVar22;
        if (uVar18 != 0) {
          uVar15 = uVar15 + 1;
          __s[uVar12] = uVar18;
        }
      }
      uVar16 = uVar16 + 0x12;
      _Var20._M_extent_value = _Var21._M_extent_value;
    } while (uVar16 < in_R8);
  }
  bVar3 = *(byte *)_Var21._M_extent_value;
  if (9 < bVar3) {
    piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
    local_48 = 10;
    fmt_02.size_ = 0x12;
    fmt_02.data_ = (char *)0x1f;
    args_02.field_1.values_ = in_R9.values_;
    args_02.desc_ = (unsigned_long_long)local_58;
    local_58[0] = (uint)bVar3;
    ::fmt::v11::vformat_abi_cxx11_
              (&sStack_88,(v11 *)"Digit {} too large for radix {}",fmt_02,args_02);
    std::invalid_argument::invalid_argument(piVar11,(string *)&sStack_88);
    __cxa_throw(piVar11,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  uVar18 = (ulong)bVar3;
  uVar12 = 10;
  if (in_R8 - uVar16 != -0x11) {
    lVar13 = 0;
    do {
      bVar3 = *(byte *)(_Var21._M_extent_value + lVar13 + 1);
      if (9 < bVar3) {
        piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
        local_48 = 10;
        fmt_00.size_ = 0x12;
        fmt_00.data_ = (char *)0x1f;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_58;
        local_58[0] = (uint)bVar3;
        ::fmt::v11::vformat_abi_cxx11_
                  (&sStack_88,(v11 *)"Digit {} too large for radix {}",fmt_00,args_00);
        std::invalid_argument::invalid_argument(piVar11,(string *)&sStack_88);
        __cxa_throw(piVar11,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      uVar19 = uVar18 * 5;
      uVar18 = (ulong)bVar3 + uVar18 * 10;
      uVar12 = uVar12 * 10;
      lVar13 = lVar13 + 1;
    } while ((in_R8 - uVar16) + 0x11 != lVar13);
  }
  if (uVar15 == 0) {
    if (uVar18 != 0) {
      *__s = uVar18;
    }
  }
  else {
    uVar14 = (ulong)uVar15;
    uVar19 = 0;
    uVar16 = 0;
    do {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar16;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar12;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = __s[uVar19];
      auVar10 = auVar6 * auVar8 + auVar10;
      uVar16 = auVar10._8_8_;
      __s[uVar19] = auVar10._0_8_;
      uVar19 = uVar19 + 1;
    } while (uVar14 != uVar19);
    uVar19 = 0;
    lVar13 = 0;
    do {
      puVar1 = __s + lVar13;
      uVar2 = (ulong)((char)uVar19 != '\0');
      uVar12 = *puVar1;
      uVar4 = *puVar1 + uVar18;
      bVar22 = CARRY8(uVar12,uVar18) || CARRY8(uVar4,uVar2);
      *puVar1 = uVar4 + uVar2;
      uVar19 = (ulong)bVar22;
      if (!CARRY8(uVar12,uVar18) && !CARRY8(uVar4,uVar2)) break;
      uVar18 = 0;
      bVar23 = uVar14 - 1 != lVar13;
      lVar13 = lVar13 + 1;
    } while (bVar23);
    uVar16 = bVar22 + uVar16;
    if (uVar16 != 0) {
      __s[uVar14] = uVar16;
    }
  }
  SVar24.super_SVIntStorage.bitWidth = (int)uVar19;
  SVar24.super_SVIntStorage.signFlag = (bool)(char)(uVar19 >> 0x20);
  SVar24.super_SVIntStorage.unknownFlag = (bool)(char)(uVar19 >> 0x28);
  SVar24.super_SVIntStorage._14_2_ = (short)(uVar19 >> 0x30);
  SVar24.super_SVIntStorage.field_0.val = aVar17.val;
  return (SVInt)SVar24.super_SVIntStorage;
}

Assistant:

SVInt SVInt::fromDecimalDigits(bitwidth_t bits, bool isSigned, std::span<logic_t const> digits) {
    SVInt result = allocZeroed(bits, isSigned, false);

    constexpr int charsPerWord = 18; // 18 decimal digits can fit in a 64-bit word
    const logic_t* d = digits.data();
    uint64_t maxWord = (uint64_t)std::pow(10, charsPerWord);
    uint32_t count = 0;
    uint64_t word;

    auto nextDigit = [&]() {
        uint8_t v = d->value;
        if (v >= 10) {
            SLANG_THROW(
                std::invalid_argument(fmt::format("Digit {} too large for radix {}", v, 10)));
        }
        d++;
        return v;
    };

    auto writeWord = [&]() {
        if (!count) {
            if (word)
                result.pVal[count++] = word;
        }
        else {
            uint64_t carry = mulOne(result.pVal, result.pVal, count, maxWord);
            carry += addOne(result.pVal, result.pVal, count, word);
            if (carry)
                result.pVal[count++] = carry;
        }
    };

    size_t i;
    for (i = charsPerWord; i < digits.size(); i += charsPerWord) {
        word = nextDigit();
        for (size_t j = charsPerWord - 1; j != 0; j--)
            word = word * 10 + nextDigit();

        writeWord();
    }

    maxWord = 10;
    word = nextDigit();

    for (size_t j = digits.size() - (i - charsPerWord) - 1; j > 0; j--) {
        word = word * 10 + nextDigit();
        maxWord *= 10;
    }

    writeWord();

    return result;
}